

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  bool bVar1;
  BasicHeapType BVar2;
  FeatureOptions<wasm::HeapType> *pFVar3;
  pointer ppVar4;
  value_type *pvVar5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *subTypes;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_e0;
  iterator iter;
  FeatureSet local_cc;
  HeapType local_c8;
  FeatureSet local_bc;
  FeatureOptions<wasm::HeapType> local_b8;
  HeapType local_88;
  FeatureSet local_7c;
  HeapType local_78 [3];
  FeatureSet local_5c;
  FeatureOptions<wasm::HeapType> local_58;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  HeapType type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = oneIn(this,3);
  if (bVar1) {
    return (HeapType)(HeapType)this_local;
  }
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if ((!bVar1) || (bVar1 = oneIn(this,2), !bVar1)) goto switchD_0019fb87_default;
  BVar2 = HeapType::getBasic((HeapType *)&this_local);
  switch(BVar2) {
  case ext:
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_b8.options._M_t._M_impl._0_8_ = 0;
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b8.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    Random::FeatureOptions<wasm::HeapType>::FeatureOptions(&local_b8);
    FeatureSet::FeatureSet(&local_bc,0x100);
    HeapType::HeapType(&local_c8,ext);
    pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>(&local_b8,local_bc,local_c8);
    FeatureSet::FeatureSet(&local_cc,0x400);
    HeapType::HeapType((HeapType *)&iter,noext);
    pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>
                       (pFVar3,local_cc,
                        (HeapType)
                        iter.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur);
    type_local = pick<wasm::HeapType>(this,pFVar3);
    Random::FeatureOptions<wasm::HeapType>::~FeatureOptions(&local_b8);
    break;
  case func:
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl._0_8_ = 0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    Random::FeatureOptions<wasm::HeapType>::FeatureOptions(&local_58);
    FeatureSet::FeatureSet(&local_5c,0x100);
    HeapType::HeapType(local_78,func);
    pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>(&local_58,local_5c,local_78[0]);
    FeatureSet::FeatureSet(&local_7c,0x400);
    HeapType::HeapType(&local_88,nofunc);
    pFVar3 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar3,local_7c,local_88);
    type_local = pick<wasm::HeapType>(this,pFVar3);
    Random::FeatureOptions<wasm::HeapType>::~FeatureOptions(&local_58);
    break;
  case any:
    bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x108));
    if (!bVar1) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd79,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    bVar1 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x108));
    if (!bVar1) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd7a,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar2 = pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this,any,eq,i31,struct_,array,none);
    HeapType::HeapType(&type_local,BVar2);
    break;
  case eq:
    bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x108));
    if (!bVar1) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd82,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    bVar1 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x108));
    if (!bVar1) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd83,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar2 = pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this,eq,i31,struct_,array,none);
    HeapType::HeapType(&type_local,BVar2);
    break;
  case i31:
    BVar2 = pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>(this,i31,none);
    HeapType::HeapType(&type_local,BVar2);
    break;
  case struct_:
    BVar2 = pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>(this,struct_,none);
    HeapType::HeapType(&type_local,BVar2);
    break;
  case array:
    BVar2 = pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>(this,array,none);
    HeapType::HeapType(&type_local,BVar2);
    break;
  case string:
    HeapType::HeapType(&type_local,string);
    break;
  case stringview_wtf8:
  case stringview_wtf16:
  case stringview_iter:
    wasm::handle_unreachable
              ("TODO: fuzz strings",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xd94);
  case none:
  case noext:
  case nofunc:
  default:
switchD_0019fb87_default:
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::find(&this->interestingHeapSubTypes,(key_type *)&this_local);
    subTypes = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::end(&this->interestingHeapSubTypes);
    bVar1 = std::__detail::operator!=
                      (&local_e0,
                       (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        *)&subTypes);
    if (bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                             *)&local_e0);
      bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(&ppVar4->second);
      if (!bVar1) {
        pvVar5 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                           (this,&ppVar4->second);
        return (HeapType)pvVar5->id;
      }
    }
    type_local.id = (uintptr_t)this_local;
  }
  return (HeapType)type_local.id;
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    switch (type.getBasic()) {
      case HeapType::func:
        // TODO: Typed function references.
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::func)
                      .add(FeatureSet::GC, HeapType::nofunc));
      case HeapType::ext:
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::ext)
                      .add(FeatureSet::GC, HeapType::noext));
      case HeapType::any:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::any,
                    HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::i31:
        return pick(HeapType::i31, HeapType::none);
      case HeapType::struct_:
        return pick(HeapType::struct_, HeapType::none);
      case HeapType::array:
        return pick(HeapType::array, HeapType::none);
      case HeapType::string:
        return HeapType::string;
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: fuzz strings");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}